

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

NonMaximumSuppressionLayerParams *
google::protobuf::Arena::
CreateMessageInternal<CoreML::Specification::NonMaximumSuppressionLayerParams>(Arena *arena)

{
  NonMaximumSuppressionLayerParams *this;
  
  if (arena == (Arena *)0x0) {
    this = (NonMaximumSuppressionLayerParams *)operator_new(0x28);
    CoreML::Specification::NonMaximumSuppressionLayerParams::NonMaximumSuppressionLayerParams
              (this,(Arena *)0x0,false);
  }
  else {
    this = (NonMaximumSuppressionLayerParams *)
           AllocateAlignedWithHook
                     (arena,0x28,
                      (type_info *)
                      &CoreML::Specification::NonMaximumSuppressionLayerParams::typeinfo);
    CoreML::Specification::NonMaximumSuppressionLayerParams::NonMaximumSuppressionLayerParams
              (this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }